

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O2

Vector<float,_4> __thiscall
deqp::gls::FragmentOpUtil::triQuadInterpolate<tcu::Vector<float,4>>
          (FragmentOpUtil *this,Vector<float,_4> *values,float xFactor,float yFactor)

{
  Vector<float,_4> *b;
  Vector<float,_4> VVar1;
  tcu local_78 [16];
  Vector<float,_4> local_68;
  tcu local_58 [16];
  tcu local_48 [16];
  Vector<float,_4> local_38;
  
  if (1.0 <= xFactor + yFactor) {
    b = values + 3;
    tcu::operator-(local_58,values + 1,b);
    tcu::operator*(local_48,1.0 - xFactor,(Vector<float,_4> *)local_58);
    tcu::operator+((tcu *)&local_38,b,(Vector<float,_4> *)local_48);
    tcu::operator-(local_78,values + 2,b);
    tcu::operator*((tcu *)&local_68,1.0 - yFactor,(Vector<float,_4> *)local_78);
  }
  else {
    tcu::operator-(local_58,values + 2,values);
    tcu::operator*(local_48,xFactor,(Vector<float,_4> *)local_58);
    tcu::operator+((tcu *)&local_38,values,(Vector<float,_4> *)local_48);
    tcu::operator-(local_78,values + 1,values);
    tcu::operator*((tcu *)&local_68,yFactor,(Vector<float,_4> *)local_78);
  }
  VVar1 = tcu::operator+((tcu *)this,&local_38,&local_68);
  return (Vector<float,_4>)VVar1.m_data;
}

Assistant:

inline T triQuadInterpolate (const T values[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}